

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_DEFAULTED_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  if (val == 0) {
    *s_out = "DW_DEFAULTED_no";
    s_out_local._4_4_ = 0;
  }
  else if (val == 1) {
    *s_out = "DW_DEFAULTED_in_class";
    s_out_local._4_4_ = 0;
  }
  else if (val == 2) {
    *s_out = "DW_DEFAULTED_out_of_class";
    s_out_local._4_4_ = 0;
  }
  else {
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_DEFAULTED_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_DEFAULTED_no:
        *s_out = "DW_DEFAULTED_no";
        return DW_DLV_OK;
    case DW_DEFAULTED_in_class:
        *s_out = "DW_DEFAULTED_in_class";
        return DW_DLV_OK;
    case DW_DEFAULTED_out_of_class:
        *s_out = "DW_DEFAULTED_out_of_class";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}